

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sh4asm.c
# Opt level: O0

char * unsigned_to_str(uint uval)

{
  bool bVar1;
  uint uVar2;
  uint digit;
  uint uStack_1c;
  _Bool leading_zero;
  uint len;
  uint idx;
  uint place;
  uint uval_local;
  
  len = 1000000000;
  uStack_1c = 0;
  bVar1 = true;
  if (uval == 0) {
    unsigned_to_str::buf[0] = '0';
    unsigned_to_str::buf[1] = '\0';
  }
  else {
    memset(unsigned_to_str::buf,0,0x10);
    idx = uval;
    while (len != 0 && uStack_1c < 0xf) {
      uVar2 = idx / len;
      if ((bVar1) && (uVar2 == 0)) {
        len = len / 10;
      }
      else {
        bVar1 = false;
        unsigned_to_str::buf[uStack_1c] = (char)uVar2 + '0';
        idx = idx - uVar2 * len;
        len = len / 10;
        uStack_1c = uStack_1c + 1;
      }
    }
  }
  return unsigned_to_str::buf;
}

Assistant:

static char const *unsigned_to_str(unsigned uval) {
#define CONVBUF_LEN 16
    static char buf[CONVBUF_LEN];
    unsigned place = 1000000000;
    unsigned idx = 0;
    unsigned len = 0;
    bool leading_zero = true;

    // special case since the leading_zero won't return anything otherwise
    if (!uval) {
        buf[0] = '0';
        buf[1] = '\0';
        return buf;
    }

    memset(buf, 0, sizeof(buf));

    while (place && idx < (CONVBUF_LEN - 1)) {
        unsigned digit = uval / place;
        if (leading_zero && digit == 0) {
            place /= 10;
            continue;
        } else {
            leading_zero = false;
        }

        buf[idx++] = digit + '0';
        uval -= digit * place;
        place /= 10;
        len++;
    }

    return buf;
}